

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

string * bin_str_to_hex(string *str)

{
  byte bVar1;
  bool bVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  byte *pbVar5;
  undefined8 uVar6;
  ostream *poVar7;
  undefined8 in_RSI;
  string *in_RDI;
  uint32_t c;
  uint8_t i;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  ostringstream ret;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdf8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  undefined8 local_190;
  ostringstream local_188 [376];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_190 = local_10;
  local_198._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    if (!bVar2) break;
    pbVar5 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_198);
    bVar1 = *pbVar5;
    uVar6 = std::ostream::operator<<(local_188,std::hex);
    _Var3 = std::setfill<char>('0');
    poVar7 = std::operator<<(uVar6,_Var3._M_c);
    _Var4 = std::setw(2);
    poVar7 = std::operator<<(poVar7,_Var4);
    in_stack_fffffffffffffe00 =
         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::ostream::operator<<(poVar7,std::uppercase);
    std::ostream::operator<<(in_stack_fffffffffffffe00,(uint)bVar1);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_198);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string bin_str_to_hex(const std::string &str) {
    std::ostringstream ret;

    for (uint8_t i : str) {
        uint32_t c = static_cast<uint32_t>(i);
        ret << std::hex << std::setfill('0') << std::setw(2) << std::uppercase
            << c;
    }
    return ret.str();
}